

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SubstHelper.hpp
# Opt level: O1

TermList Kernel::SubstHelper::applyImpl<false,Shell::Rectify>
                   (TermList trm,Rectify *applicator,bool noSharing)

{
  TermList TVar1;
  uint uVar2;
  
  uVar2 = (uint)trm._content & 3;
  if (uVar2 != 3) {
    if (uVar2 == 1) {
      uVar2 = Shell::Rectify::rectifyVar(applicator,(uint)(trm._content >> 2));
      TVar1._content = (uint64_t)(uVar2 * 4 + 1);
    }
    else {
      TVar1._content = (uint64_t)applyImpl<false,Shell::Rectify>(trm._content,applicator,noSharing);
    }
    return (TermList)TVar1._content;
  }
  return (TermList)(ulong)((uint)trm._content | 3);
}

Assistant:

TermList SubstHelper::applyImpl(TermList trm, Applicator& applicator, bool noSharing)
{
  using namespace SubstHelper_Aux;

  if(trm.isOrdinaryVar()) {
    return applicator.apply(trm.var());
  }
  else if(trm.isSpecialVar()) {
    return SpecVarHandler<ProcessSpecVars>::apply(applicator, trm.var());
  }
  else {
    ASS(trm.isTerm());
    return TermList(applyImpl<ProcessSpecVars>(trm.term(), applicator, noSharing));
  }
}